

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ComputeShaderGeneratedSeparateCase::runComputeShader
          (ComputeShaderGeneratedSeparateCase *this)

{
  code *pcVar1;
  IVec3 *pIVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  int size;
  int size_00;
  int size_01;
  int *local_ee0;
  MessageBuilder local_e68;
  string local_ce8;
  MessageBuilder local_cc8;
  MessageBuilder local_b48;
  uint local_9c4;
  undefined1 local_9c0 [4];
  int bufferSize_2;
  IVec3 indexBufferDispatchSize;
  int bindingPoint_2;
  string local_830;
  MessageBuilder local_810;
  MessageBuilder local_690;
  uint local_50c;
  undefined1 local_508 [4];
  int bufferSize_1;
  IVec3 dataBufferDispatchSize;
  IVec3 drawArraysDataBufferDispatchSize;
  IVec3 drawElementsDataBufferDispatchSize;
  int bindingPoint_1;
  string local_360;
  MessageBuilder local_340;
  MessageBuilder local_1b0;
  uint local_2c;
  undefined1 local_28 [4];
  int bufferSize;
  IVec3 commandDispatchSize;
  int bindingPoint;
  Functions *gl;
  ComputeShaderGeneratedSeparateCase *this_local;
  
  pRVar7 = Context::getRenderContext
                     ((this->super_ComputeShaderGeneratedCase).super_TestCase.m_context);
  iVar3 = (*pRVar7->_vptr_RenderContext[3])();
  register0x00000000 = CONCAT44(extraout_var,iVar3);
  if (((this->super_ComputeShaderGeneratedCase).m_computeCmd & 1U) != 0) {
    commandDispatchSize.m_data[1] = 0;
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)local_28,(this->super_ComputeShaderGeneratedCase).m_numDrawCmds,1,1
              );
    local_2c = (this->super_ComputeShaderGeneratedCase).m_commandSize *
               (this->super_ComputeShaderGeneratedCase).m_numDrawCmds;
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x1680);
    dVar4 = glu::ShaderProgram::getProgram(this->m_computeCmdProgram);
    (*pcVar1)(dVar4);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1b0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_1b0,(char (*) [41])"Binding command buffer to binding point ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,commandDispatchSize.m_data + 1);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1b0);
    (**(code **)(stack0xffffffffffffffe8 + 0x48))
              (0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_cmdBufferID);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_340,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_340,(char (*) [44])"Allocating memory for command buffer, size ");
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_360,(_anonymous_namespace_ *)(ulong)local_2c,size);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_360);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0xf5dc26);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_360);
    tcu::MessageBuilder::~MessageBuilder(&local_340);
    (**(code **)(stack0xffffffffffffffe8 + 0x150))(0x90d2,(long)(int)local_2c,0,0x88e8);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)(drawElementsDataBufferDispatchSize.m_data + 2),pTVar8,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)(drawElementsDataBufferDispatchSize.m_data + 2),
                        (char (*) [37])"Dispatching command compute, size = ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(Vector<int,_3> *)local_28);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder
              ((MessageBuilder *)(drawElementsDataBufferDispatchSize.m_data + 2));
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x528);
    iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_28);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_28);
    iVar6 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_28);
    (*pcVar1)(iVar3,iVar5,iVar6);
    dVar4 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
    glu::checkError(dVar4,"calculate cmd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x71f);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeData & 1U) != 0) {
    drawElementsDataBufferDispatchSize.m_data[1] = 0;
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(drawArraysDataBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_gridSize + 1,
               (this->super_ComputeShaderGeneratedCase).m_gridSize + 1,1);
    tcu::Vector<int,_3>::Vector
              ((Vector<int,_3> *)(dataBufferDispatchSize.m_data + 1),
               (this->super_ComputeShaderGeneratedCase).m_gridSize,
               (this->super_ComputeShaderGeneratedCase).m_gridSize,1);
    if ((this->super_ComputeShaderGeneratedCase).m_drawMethod == DRAWMETHOD_DRAWELEMENTS) {
      pIVar2 = &drawArraysDataBufferDispatchSize;
    }
    else {
      pIVar2 = &dataBufferDispatchSize;
    }
    local_ee0 = pIVar2->m_data + 1;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_508,(Vector<int,_3> *)local_ee0);
    dVar4 = ComputeShaderGeneratedCase::calcDrawBufferSize(&this->super_ComputeShaderGeneratedCase);
    local_50c = dVar4 << 4;
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x1680);
    dVar4 = glu::ShaderProgram::getProgram(this->m_computeDataProgram);
    (*pcVar1)(dVar4);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_690,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_690,(char (*) [38])"Binding data buffer to binding point ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,drawElementsDataBufferDispatchSize.m_data + 1);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_690);
    (**(code **)(stack0xffffffffffffffe8 + 0x48))
              (0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_dataBufferID);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_810,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_810,(char (*) [41])"Allocating memory for data buffer, size ");
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_830,(_anonymous_namespace_ *)(ulong)local_50c,size_00);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_830);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0xf5dc26);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_830);
    tcu::MessageBuilder::~MessageBuilder(&local_810);
    (**(code **)(stack0xffffffffffffffe8 + 0x150))(0x90d2,(long)(int)local_50c,0,0x88e8);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)(indexBufferDispatchSize.m_data + 2),pTVar8,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)(indexBufferDispatchSize.m_data + 2),
                        (char (*) [34])"Dispatching data compute, size = ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(Vector<int,_3> *)local_508);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(indexBufferDispatchSize.m_data + 2));
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x528);
    iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_508);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_508);
    iVar6 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_508);
    (*pcVar1)(iVar3,iVar5,iVar6);
    dVar4 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
    glu::checkError(dVar4,"calculate data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x73b);
  }
  if (((this->super_ComputeShaderGeneratedCase).m_computeIndices & 1U) != 0) {
    indexBufferDispatchSize.m_data[1] = 0;
    iVar3 = (this->super_ComputeShaderGeneratedCase).m_gridSize;
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)local_9c0,iVar3,iVar3,1);
    dVar4 = ComputeShaderGeneratedCase::calcIndexBufferSize(&this->super_ComputeShaderGeneratedCase)
    ;
    local_9c4 = dVar4 << 2;
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x1680);
    dVar4 = glu::ShaderProgram::getProgram(this->m_computeIndicesProgram);
    (*pcVar1)(dVar4);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_b48,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_b48,(char (*) [39])"Binding index buffer to binding point ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,indexBufferDispatchSize.m_data + 1);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_b48);
    (**(code **)(stack0xffffffffffffffe8 + 0x48))
              (0x90d2,0,(this->super_ComputeShaderGeneratedCase).m_indexBufferID);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_cc8,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_cc8,(char (*) [42])"Allocating memory for index buffer, size ");
    (anonymous_namespace)::sizeToString_abi_cxx11_
              (&local_ce8,(_anonymous_namespace_ *)(ulong)local_9c4,size_01);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_ce8);
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0xf5dc26);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&local_ce8);
    tcu::MessageBuilder::~MessageBuilder(&local_cc8);
    (**(code **)(stack0xffffffffffffffe8 + 0x150))(0x90d2,(long)(int)local_9c4,0,0x88e8);
    pTVar8 = tcu::TestContext::getLog
                       ((this->super_ComputeShaderGeneratedCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_e68,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar9 = tcu::MessageBuilder::operator<<
                       (&local_e68,(char (*) [35])"Dispatching index compute, size = ");
    pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(Vector<int,_3> *)local_9c0);
    tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_e68);
    pcVar1 = *(code **)(stack0xffffffffffffffe8 + 0x528);
    iVar3 = tcu::Vector<int,_3>::x((Vector<int,_3> *)local_9c0);
    iVar5 = tcu::Vector<int,_3>::y((Vector<int,_3> *)local_9c0);
    iVar6 = tcu::Vector<int,_3>::z((Vector<int,_3> *)local_9c0);
    (*pcVar1)(iVar3,iVar5,iVar6);
    dVar4 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
    glu::checkError(dVar4,"calculate indices",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                    ,0x757);
  }
  dVar4 = (**(code **)(stack0xffffffffffffffe8 + 0x800))();
  glu::checkError(dVar4,"post dispatch",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawTests.cpp"
                  ,0x75a);
  return;
}

Assistant:

void ComputeShaderGeneratedSeparateCase::runComputeShader (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// Compute command

	if (m_computeCmd)
	{
		const int				bindingPoint			= 0;
		const tcu::IVec3		commandDispatchSize		(m_numDrawCmds, 1, 1);
		const int				bufferSize				= m_commandSize * m_numDrawCmds;

		gl.useProgram(m_computeCmdProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding command buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_cmdBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for command buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching command compute, size = " << commandDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(commandDispatchSize.x(), commandDispatchSize.y(), commandDispatchSize.z());

		glu::checkError(gl.getError(), "calculate cmd", __FILE__, __LINE__);
	}

	// Compute data

	if (m_computeData)
	{
		const int				bindingPoint						= 0;
		const tcu::IVec3		drawElementsDataBufferDispatchSize	(m_gridSize+1, m_gridSize+1, 1);
		const tcu::IVec3		drawArraysDataBufferDispatchSize	(m_gridSize,   m_gridSize,   1);
		const tcu::IVec3		dataBufferDispatchSize				= (m_drawMethod == DRAWMETHOD_DRAWELEMENTS) ? (drawElementsDataBufferDispatchSize) : (drawArraysDataBufferDispatchSize);
		const int				bufferSize							= (int)(calcDrawBufferSize()*sizeof(tcu::Vec4));

		gl.useProgram(m_computeDataProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding data buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_dataBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for data buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching data compute, size = " << dataBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(dataBufferDispatchSize.x(), dataBufferDispatchSize.y(), dataBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate data", __FILE__, __LINE__);
	}

	// Compute indices

	if (m_computeIndices)
	{
		const int				bindingPoint				= 0;
		const tcu::IVec3		indexBufferDispatchSize		(m_gridSize, m_gridSize, 1);
		const int				bufferSize					= (int)(calcIndexBufferSize()*sizeof(deUint32));

		DE_ASSERT(m_drawMethod == DRAWMETHOD_DRAWELEMENTS);

		gl.useProgram(m_computeIndicesProgram->getProgram());

		// setup buffers

		m_testCtx.getLog() << tcu::TestLog::Message << "Binding index buffer to binding point " << bindingPoint << tcu::TestLog::EndMessage;
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, bindingPoint, m_indexBufferID);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating memory for index buffer, size " << sizeToString(bufferSize) << "." << tcu::TestLog::EndMessage;
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, DE_NULL, GL_DYNAMIC_DRAW);

		// calculate

		m_testCtx.getLog() << tcu::TestLog::Message << "Dispatching index compute, size = " << indexBufferDispatchSize << tcu::TestLog::EndMessage;
		gl.dispatchCompute(indexBufferDispatchSize.x(), indexBufferDispatchSize.y(), indexBufferDispatchSize.z());

		glu::checkError(gl.getError(), "calculate indices", __FILE__, __LINE__);
	}

	glu::checkError(gl.getError(), "post dispatch", __FILE__, __LINE__);
}